

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O1

YSRESULT __thiscall YsSoundPlayer::SoundData::LoadWav(SoundData *this,char *fn)

{
  YSRESULT YVar1;
  FILE *__stream;
  BinaryInStream local_28;
  FILE *local_20;
  
  YVar1 = YSERR;
  printf("Loading %s\n");
  __stream = fopen(fn,"rb");
  if (__stream != (FILE *)0x0) {
    local_28._vptr_BinaryInStream = (_func_int **)&PTR_Fetch_0011cc48;
    local_20 = __stream;
    YVar1 = LoadWav(this,&local_28);
    fclose(__stream);
  }
  return YVar1;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::LoadWav(const char fn[])
{
	FILE *fp;
	printf("Loading %s\n",fn);
	fp=fopen(fn,"rb");
	if(fp!=NULL)
	{
		auto res=LoadWav(fp);
		fclose(fp);
		return res;
	}
	return YSERR;
}